

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O3

int parse_source_token_maybe_relative(Context_conflict *ctx,int relok)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  MOJOSHADER_shaderType MVar4;
  undefined2 uVar5;
  undefined3 uVar6;
  undefined1 uVar7;
  MOJOSHADER_shaderType MVar8;
  Token TVar9;
  int iVar10;
  int iVar11;
  size_t __n;
  uint uVar12;
  uint uVar13;
  long lVar14;
  char *pcVar15;
  byte *pbVar16;
  uint32 ui32;
  int regnum;
  RegisterType regtype;
  undefined4 local_58;
  undefined1 local_54;
  MOJOSHADER_shaderType local_50;
  int local_4c;
  uint *local_48;
  RegisterType local_3c;
  long local_38;
  
  pbVar16 = (byte *)&local_58;
  lVar14 = (long)ctx->tokenbufpos;
  if (0xf < lVar14) {
    failf(ctx,"%s","Too many tokens");
    return 0;
  }
  ctx->tokenbufpos = ctx->tokenbufpos + 1;
  ctx->tokenbuf[lVar14] = 0;
  TVar9 = nexttoken(ctx);
  if (TVar9 == 0x21) {
    iVar10 = 0xd;
LAB_001242c8:
    bVar2 = false;
LAB_001242cb:
    parse_register_name(ctx,&local_3c,(int *)&local_50);
    local_48 = &ctx->tokenlen;
    local_4c = iVar10;
    if (ctx->tokenlen != 0) {
      iVar11 = check_token_segment(ctx,"_bias");
      if (iVar11 == 0) {
        iVar11 = check_token_segment(ctx,"_bx2");
        if (iVar11 == 0) {
          iVar11 = check_token_segment(ctx,"_x2");
          if (iVar11 == 0) {
            iVar11 = check_token_segment(ctx,"_dz");
            if ((iVar11 == 0) && (iVar11 = check_token_segment(ctx,"_db"), iVar11 == 0)) {
              iVar11 = check_token_segment(ctx,"_dw");
              if ((iVar11 == 0) && (iVar11 = check_token_segment(ctx,"_da"), iVar11 == 0)) {
                iVar11 = check_token_segment(ctx,"_abs");
                pcVar15 = "Invalid source modifier";
                if (iVar11 != 0) {
                  pcVar15 = "Incompatible source modifiers";
                }
                local_4c = 0xb;
                if (!(bool)(iVar11 != 0 & bVar2)) goto LAB_001243a3;
                goto LAB_001243ba;
              }
              local_4c = 10;
            }
            else {
              local_4c = 9;
            }
          }
          else {
            local_4c = 7;
          }
        }
        else {
          local_4c = 4;
        }
      }
      else {
        local_4c = 2;
      }
      if (!bVar2) {
        pcVar15 = "Incompatible source modifiers";
        goto LAB_001243a3;
      }
    }
  }
  else {
    if (TVar9 != 0x2d) {
      if ((TVar9 == TOKEN_INT_LITERAL) && (iVar10 = check_token(ctx,"1"), iVar10 != 0)) {
        TVar9 = nexttoken(ctx);
        if (TVar9 == 0x2d) {
          iVar10 = 6;
          goto LAB_001242c8;
        }
        failf(ctx,"%s","Unexpected token");
      }
      else {
        if (ctx->pushedback != 0) goto LAB_00124751;
        ctx->pushedback = 1;
      }
      iVar10 = 0;
      bVar2 = true;
      goto LAB_001242cb;
    }
    parse_register_name(ctx,&local_3c,(int *)&local_50);
    local_48 = &ctx->tokenlen;
    if (ctx->tokenlen == 0) {
      local_4c = 1;
    }
    else {
      iVar10 = check_token_segment(ctx,"_bias");
      local_4c = 3;
      if (iVar10 != 0) goto LAB_001243ba;
      iVar10 = check_token_segment(ctx,"_bx2");
      local_4c = 5;
      if (iVar10 != 0) goto LAB_001243ba;
      iVar10 = check_token_segment(ctx,"_x2");
      local_4c = 8;
      if (iVar10 != 0) goto LAB_001243ba;
      iVar11 = check_token_segment(ctx,"_dz");
      iVar10 = 0;
      pcVar15 = "Incompatible source modifiers";
      if ((((iVar11 == 0) && (iVar11 = check_token_segment(ctx,"_db"), iVar11 == 0)) &&
          (iVar11 = check_token_segment(ctx,"_dw"), iVar11 == 0)) &&
         (iVar11 = check_token_segment(ctx,"_da"), iVar10 = 0, iVar11 == 0)) {
        iVar11 = check_token_segment(ctx,"_abs");
        local_4c = 0xc;
        if (iVar11 != 0) goto LAB_001243ba;
        pcVar15 = "Invalid source modifier";
      }
LAB_001243a3:
      local_4c = iVar10;
      failf(ctx,"%s",pcVar15);
    }
  }
LAB_001243ba:
  TVar9 = nexttoken(ctx);
  if (TVar9 == 0x5b) {
    iVar10 = 2;
    if (relok == 0) {
      failf(ctx,"%s","Relative addressing not permitted here.");
      iVar10 = 1;
    }
    parse_source_token_maybe_relative(ctx,0);
    TVar9 = nexttoken(ctx);
    if (TVar9 == 0x2b) {
      if (local_50 != MOJOSHADER_TYPE_UNKNOWN) {
        failf(ctx,"%s","Relative addressing with explicit register number.");
      }
      local_58 = 0;
      TVar9 = nexttoken(ctx);
      if (((TVar9 != TOKEN_INT_LITERAL) || (iVar11 = ui32fromtoken(ctx,&local_58), iVar11 == 0)) ||
         (*local_48 != 0)) {
        failf(ctx,"%s","Invalid relative addressing offset");
      }
      local_50 = local_50 + local_58;
    }
    else {
      if (ctx->pushedback != 0) goto LAB_00124751;
      ctx->pushedback = 1;
    }
    TVar9 = nexttoken(ctx);
    uVar12 = 0x2000;
    if (TVar9 != 0x5d) {
      failf(ctx,"%s","Expected \']\'");
    }
  }
  else {
    if (ctx->pushedback != 0) goto LAB_00124751;
    ctx->pushedback = 1;
    iVar10 = 1;
    uVar12 = 0;
  }
  TVar9 = nexttoken(ctx);
  MVar8 = local_50;
  local_38 = lVar14;
  if (TVar9 != 0x2e) {
    if (ctx->pushedback != 0) {
LAB_00124751:
      __assert_fail("!ctx->pushedback",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_assembler.c"
                    ,0x9f,"void pushback(Context *)");
    }
    ctx->pushedback = 1;
    iVar11 = 0xe40000;
    goto LAB_001246a0;
  }
  switch(local_3c) {
  case REG_TYPE_SAMPLER:
  case REG_TYPE_CONST2:
  case REG_TYPE_CONST3:
  case REG_TYPE_CONST4:
  case REG_TYPE_TEMPFLOAT16:
  case REG_TYPE_LABEL:
    goto switchD_0012450c_caseD_a;
  case REG_TYPE_MISCTYPE:
    MVar4 = local_50;
    goto joined_r0x00124563;
  case REG_TYPE_MAX:
    MVar4 = ctx->shader_type;
joined_r0x00124563:
    if (MVar4 == MOJOSHADER_TYPE_PIXEL) goto switchD_0012450c_caseD_9;
switchD_0012450c_caseD_a:
    TVar9 = nexttoken(ctx);
    iVar11 = 0;
    if (TVar9 == TOKEN_IDENTIFIER) {
      local_48 = (uint *)CONCAT44(local_48._4_4_,iVar10);
      local_54 = 0;
      local_58 = 0;
      uVar13 = ctx->tokenlen;
      __n = 4;
      if (uVar13 < 4) {
        __n = (size_t)uVar13;
      }
      memcpy(&local_58,ctx->token,__n);
      bVar3 = false;
      uVar6 = (undefined3)local_58;
      uVar5 = (undefined2)local_58;
      bVar2 = false;
      switch(uVar13) {
      case 1:
        bVar1 = (byte)local_58;
        local_58._0_3_ = CONCAT12((byte)local_58,uVar5);
        local_58 = CONCAT13(bVar1,(undefined3)local_58);
        local_58._0_2_ = CONCAT11(bVar1,bVar1);
        bVar2 = bVar3;
        break;
      case 2:
        uVar7 = local_58._1_1_;
        local_58._0_3_ = CONCAT12(local_58._1_1_,uVar5);
        local_58 = CONCAT13(uVar7,(undefined3)local_58);
        bVar2 = bVar3;
        break;
      case 3:
        local_58 = CONCAT13(local_58._2_1_,uVar6);
        bVar2 = bVar3;
        break;
      case 4:
        break;
      default:
        bVar2 = true;
      }
      local_54 = 0;
      lVar14 = 0;
      iVar10 = 0;
      uVar13 = 0;
      do {
        bVar1 = *pbVar16;
        if (bVar1 < 0x72) {
          if (bVar1 == 0x61) goto switchD_0012462f_caseD_77;
          if (bVar1 == 0x62) goto switchD_0012462f_caseD_7a;
          if (bVar1 == 0x67) goto switchD_0012462f_caseD_79;
switchD_0012462f_caseD_73:
          bVar2 = true;
        }
        else {
          switch(bVar1) {
          case 0x72:
          case 0x78:
            iVar10 = 0;
            break;
          default:
            goto switchD_0012462f_caseD_73;
          case 0x77:
switchD_0012462f_caseD_77:
            iVar10 = 3;
            break;
          case 0x79:
switchD_0012462f_caseD_79:
            iVar10 = 1;
            break;
          case 0x7a:
switchD_0012462f_caseD_7a:
            iVar10 = 2;
          }
        }
        uVar13 = uVar13 | iVar10 << ((byte)lVar14 & 0x1f);
        lVar14 = lVar14 + 2;
        pbVar16 = pbVar16 + 1;
      } while (lVar14 != 8);
      iVar11 = (uVar13 & 0xff) << 0x10;
      iVar10 = (int)local_48;
      if (!bVar2) goto LAB_001246a0;
    }
    pcVar15 = "Invalid swizzle";
    break;
  default:
    if ((local_3c != REG_TYPE_RASTOUT) || (1 < local_50 - MOJOSHADER_TYPE_PIXEL))
    goto switchD_0012450c_caseD_a;
  case REG_TYPE_DEPTHOUT:
  case REG_TYPE_CONSTBOOL:
  case REG_TYPE_LOOP:
switchD_0012450c_caseD_9:
    pcVar15 = "Swizzle specified for scalar register";
    iVar11 = 0;
  }
  failf(ctx,"%s",pcVar15);
LAB_001246a0:
  ctx->tokenbuf[local_38] =
       (local_3c & (REG_TYPE_TEMPFLOAT16|REG_TYPE_COLOROUT)) << 8 |
       local_3c * 0x10000000 + (uVar12 | local_4c << 0x18) + (MVar8 & 0x7ff) + iVar11 | 0x80000000;
  return iVar10;
}

Assistant:

static int parse_source_token_maybe_relative(Context *ctx, const int relok)
{
    int retval = 1;

    if (tokenbuf_overflow(ctx))
        return 0;

    // mark this now, so optional relative addressing token is placed second.
    uint32 *outtoken = &ctx->tokenbuf[ctx->tokenbufpos++];
    *outtoken = 0;

    SourceMod srcmod = SRCMOD_NONE;
    int negate = 0;
    Token token = nexttoken(ctx);

    if (token == ((Token) '!'))
        srcmod = SRCMOD_NOT;
    else if (token == ((Token) '-'))
        negate = 1;
    else if ( (token == TOKEN_INT_LITERAL) && (check_token(ctx, "1")) )
    {
        if (nexttoken(ctx) != ((Token) '-'))
            fail(ctx, "Unexpected token");
        else
            srcmod = SRCMOD_COMPLEMENT;
    } // else
    else
    {
        pushback(ctx);
    } // else

    RegisterType regtype;
    int regnum;
    parse_register_name(ctx, &regtype, &regnum);

    if (ctx->tokenlen == 0)
    {
        if (negate)
            set_source_mod(ctx, negate, SRCMOD_NONE, SRCMOD_NEGATE, &srcmod);
    } // if
    else
    {
        assert(ctx->tokenlen > 0);
        if (check_token_segment(ctx, "_bias"))
            set_source_mod(ctx, negate, SRCMOD_BIAS, SRCMOD_BIASNEGATE, &srcmod);
        else if (check_token_segment(ctx, "_bx2"))
            set_source_mod(ctx, negate, SRCMOD_SIGN, SRCMOD_SIGNNEGATE, &srcmod);
        else if (check_token_segment(ctx, "_x2"))
            set_source_mod(ctx, negate, SRCMOD_X2, SRCMOD_X2NEGATE, &srcmod);
        else if (check_token_segment(ctx, "_dz"))
            set_source_mod(ctx, negate, SRCMOD_DZ, SRCMOD_NONE, &srcmod);
        else if (check_token_segment(ctx, "_db"))
            set_source_mod(ctx, negate, SRCMOD_DZ, SRCMOD_NONE, &srcmod);
        else if (check_token_segment(ctx, "_dw"))
            set_source_mod(ctx, negate, SRCMOD_DW, SRCMOD_NONE, &srcmod);
        else if (check_token_segment(ctx, "_da"))
            set_source_mod(ctx, negate, SRCMOD_DW, SRCMOD_NONE, &srcmod);
        else if (check_token_segment(ctx, "_abs"))
            set_source_mod(ctx, negate, SRCMOD_ABS, SRCMOD_ABSNEGATE, &srcmod);
        else
            fail(ctx, "Invalid source modifier");
    } // else

    uint32 relative = 0;
    if (nexttoken(ctx) != ((Token) '['))
        pushback(ctx);  // not relative addressing?
    else
    {
        if (!relok)
            fail(ctx, "Relative addressing not permitted here.");
        else
            retval++;

        parse_source_token_maybe_relative(ctx, 0);
        relative = 1;

        if (nexttoken(ctx) != ((Token) '+'))
            pushback(ctx);
        else
        {
            // !!! FIXME: maybe c3[a0.x + 5] is legal and becomes c[a0.x + 8] ?
            if (regnum != 0)
                fail(ctx, "Relative addressing with explicit register number.");

            uint32 ui32 = 0;
            if ( (nexttoken(ctx) != TOKEN_INT_LITERAL) ||
                 (!ui32fromtoken(ctx, &ui32)) ||
                 (ctx->tokenlen != 0) )
            {
                fail(ctx, "Invalid relative addressing offset");
            } // if
            regnum += (int) ui32;
        } // else

        if (nexttoken(ctx) != ((Token) ']'))
            fail(ctx, "Expected ']'");
    } // else

    int invalid_swizzle = 0;
    uint32 swizzle = 0;
    if (nexttoken(ctx) != ((Token) '.'))
    {
        swizzle = 0xE4;  // 0xE4 == 11100100 ... 0 1 2 3. No swizzle.
        pushback(ctx);  // no explicit writemask; do full mask.
    } // if
    else if (scalar_register(ctx->shader_type, regtype, regnum))
        fail(ctx, "Swizzle specified for scalar register");
    else if (nexttoken(ctx) != TOKEN_IDENTIFIER)
        invalid_swizzle = 1;
    else
    {
        char tokenbytes[5] = { '\0', '\0', '\0', '\0', '\0' };
        const unsigned int tokenlen = ctx->tokenlen;
        memcpy(tokenbytes, ctx->token, ((tokenlen < 4) ? tokenlen : 4));

        // deal with shortened form (.x = .xxxx, etc).
        if (tokenlen == 1)
            tokenbytes[1] = tokenbytes[2] = tokenbytes[3] = tokenbytes[0];
        else if (tokenlen == 2)
            tokenbytes[2] = tokenbytes[3] = tokenbytes[1];
        else if (tokenlen == 3)
            tokenbytes[3] = tokenbytes[2];
        else if (tokenlen != 4)
            invalid_swizzle = 1;
        tokenbytes[4] = '\0';

        uint32 val = 0;
        int i;
        for (i = 0; i < 4; i++)
        {
            const int component = (int) tokenbytes[i];
            switch (component)
            {
                case 'r': case 'x': val = 0; break;
                case 'g': case 'y': val = 1; break;
                case 'b': case 'z': val = 2; break;
                case 'a': case 'w': val = 3; break;
                default: invalid_swizzle = 1; break;
            } // switch
            swizzle |= (val << (i * 2));
        } // for
    } // else

    if (invalid_swizzle)
        fail(ctx, "Invalid swizzle");

    *outtoken = ( ((((uint32) 1)) << 31) |
                  ((((uint32) regnum) & 0x7ff) << 0) |
                  ((((uint32) relative) & 0x1) << 13) |
                  ((((uint32) swizzle) & 0xFF) << 16) |
                  ((((uint32) srcmod) & 0xF) << 24) |
                  ((((uint32) regtype) & 0x7) << 28) |
                  ((((uint32) regtype) & 0x18) << 8) );

    return retval;
}